

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Aggregate_State_PDU::Encode(Aggregate_State_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pAVar3;
  pointer pEVar4;
  pointer pSVar5;
  pointer pSVar6;
  reference this_00;
  VariableDatum *pVVar7;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>_>
  local_70;
  __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>_>
  local_68;
  const_iterator citrVD;
  __normal_iterator<const_KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
  local_58;
  const_iterator citrSES;
  __normal_iterator<const_KDIS::DATA_TYPE::SilentAggregateSystem_*,_std::vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>_>
  local_48;
  const_iterator citrSAS;
  KUINT16 p;
  const_iterator cStack_38;
  KUINT8 ui8Padding;
  __normal_iterator<const_KDIS::DATA_TYPE::EntityIdentifier_*,_std::vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>_>
  local_30;
  const_iterator citrEI;
  __normal_iterator<const_KDIS::DATA_TYPE::AggregateIdentifier_*,_std::vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>_>
  local_20;
  const_iterator citrAI;
  KDataStream *stream_local;
  Aggregate_State_PDU *this_local;
  
  citrAI._M_current = (AggregateIdentifier *)stream;
  Header7::Encode(&this->super_Header,stream);
  pKVar2 = DATA_TYPE::operator<<
                     ((KDataStream *)citrAI._M_current,(DataTypeBase *)&this->m_AggregateID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8ForceID);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui8AggState);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_AggregateType).super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui32Formation);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_AggregateMarking).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_Dimensions).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_Ori).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_CtrOfMassLoc).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_Vel).super_DataTypeBase);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16NumAggregates);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16NumEntities);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16NumSilentAggregateTypes);
  KDataStream::operator<<(pKVar2,this->m_ui16NumSilentEntityTypes);
  local_20._M_current =
       (AggregateIdentifier *)
       std::
       vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
       ::begin(&this->m_vAI);
  while( true ) {
    citrEI._M_current =
         (EntityIdentifier *)
         std::
         vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
         ::end(&this->m_vAI);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<const_KDIS::DATA_TYPE::AggregateIdentifier_*,_std::vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>_>
                        *)&citrEI);
    if (!bVar1) break;
    pAVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::AggregateIdentifier_*,_std::vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>_>
             ::operator->(&local_20);
    (*(pAVar3->super_SimulationIdentifier).super_DataTypeBase._vptr_DataTypeBase[5])
              (pAVar3,citrAI._M_current);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::AggregateIdentifier_*,_std::vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>_>
    ::operator++(&local_20);
  }
  local_30._M_current =
       (EntityIdentifier *)
       std::
       vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
       ::begin(&this->m_vEI);
  while( true ) {
    cStack_38 = std::
                vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>
                ::end(&this->m_vEI);
    bVar1 = __gnu_cxx::operator!=(&local_30,&stack0xffffffffffffffc8);
    if (!bVar1) break;
    pEVar4 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::EntityIdentifier_*,_std::vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>_>
             ::operator->(&local_30);
    (*(pEVar4->super_SimulationIdentifier).super_DataTypeBase._vptr_DataTypeBase[5])
              (pEVar4,citrAI._M_current);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::EntityIdentifier_*,_std::vector<KDIS::DATA_TYPE::EntityIdentifier,_std::allocator<KDIS::DATA_TYPE::EntityIdentifier>_>_>
    ::operator++(&local_30);
  }
  bVar1 = needsPadding(this);
  if (bVar1) {
    citrSAS._M_current._7_1_ = 0;
    for (citrSAS._M_current._4_2_ = 0; citrSAS._M_current._4_2_ < this->m_ui16NumberOfPaddingOctets;
        citrSAS._M_current._4_2_ = citrSAS._M_current._4_2_ + 1) {
      KDataStream::operator<<((KDataStream *)citrAI._M_current,'\0');
    }
  }
  local_48._M_current =
       (SilentAggregateSystem *)
       std::
       vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
       ::begin(&this->m_vSASL);
  while( true ) {
    citrSES._M_current =
         (SilentEntitySystem *)
         std::
         vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>
         ::end(&this->m_vSASL);
    bVar1 = __gnu_cxx::operator!=
                      (&local_48,
                       (__normal_iterator<const_KDIS::DATA_TYPE::SilentAggregateSystem_*,_std::vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>_>
                        *)&citrSES);
    if (!bVar1) break;
    pSVar5 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::SilentAggregateSystem_*,_std::vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>_>
             ::operator->(&local_48);
    (*(pSVar5->super_DataTypeBase)._vptr_DataTypeBase[5])(pSVar5,citrAI._M_current);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::SilentAggregateSystem_*,_std::vector<KDIS::DATA_TYPE::SilentAggregateSystem,_std::allocator<KDIS::DATA_TYPE::SilentAggregateSystem>_>_>
    ::operator++(&local_48);
  }
  local_58._M_current =
       (SilentEntitySystem *)
       std::
       vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
       ::begin(&this->m_vSESL);
  while( true ) {
    citrVD._M_current =
         (KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)
         std::
         vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>
         ::end(&this->m_vSESL);
    bVar1 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<const_KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
                        *)&citrVD);
    if (!bVar1) break;
    pSVar6 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
             ::operator->(&local_58);
    (*(pSVar6->super_DataTypeBase)._vptr_DataTypeBase[5])(pSVar6,citrAI._M_current);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::SilentEntitySystem_*,_std::vector<KDIS::DATA_TYPE::SilentEntitySystem,_std::allocator<KDIS::DATA_TYPE::SilentEntitySystem>_>_>
    ::operator++(&local_58);
  }
  KDataStream::operator<<((KDataStream *)citrAI._M_current,this->m_ui32NumVariableDatum);
  local_68._M_current =
       (KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)
       std::
       vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
       ::begin(&this->m_vVD);
  while( true ) {
    local_70._M_current =
         (KRef_Ptr<KDIS::DATA_TYPE::VariableDatum> *)
         std::
         vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>
         ::end(&this->m_vVD);
    bVar1 = __gnu_cxx::operator!=(&local_68,&local_70);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>_>
              ::operator*(&local_68);
    pVVar7 = UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>::operator->(this_00);
    (*(pVVar7->super_DataTypeBase)._vptr_DataTypeBase[5])(pVVar7,citrAI._M_current);
    __gnu_cxx::
    __normal_iterator<const_KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_*,_std::vector<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>,_std::allocator<KDIS::UTILS::KRef_Ptr<KDIS::DATA_TYPE::VariableDatum>_>_>_>
    ::operator++(&local_68);
  }
  return;
}

Assistant:

void Aggregate_State_PDU::Encode( KDataStream & stream ) const
{
    Header::Encode( stream );

    stream << KDIS_STREAM m_AggregateID
           << m_ui8ForceID
           << m_ui8AggState
           << KDIS_STREAM m_AggregateType
           << m_ui32Formation
           << KDIS_STREAM m_AggregateMarking
           << KDIS_STREAM m_Dimensions
           << KDIS_STREAM m_Ori
           << KDIS_STREAM m_CtrOfMassLoc
           << KDIS_STREAM m_Vel
           << m_ui16NumAggregates
           << m_ui16NumEntities
           << m_ui16NumSilentAggregateTypes
           << m_ui16NumSilentEntityTypes;

    vector<AggregateIdentifier>::const_iterator citrAI = m_vAI.begin();
    for( ; citrAI != m_vAI.end(); ++citrAI )
    {
        citrAI->Encode( stream );
    }

    vector<EntityIdentifier>::const_iterator citrEI = m_vEI.begin();
    for( ; citrEI != m_vEI.end(); ++citrEI )
    {
        citrEI->Encode( stream );
    }

    if( needsPadding() )
    {
        const KUINT8 ui8Padding = 0;
        for( KUINT16 p = 0; p < m_ui16NumberOfPaddingOctets; ++p )
        {
            stream << ui8Padding;
        }
    }

    vector<SilentAggregateSystem>::const_iterator citrSAS = m_vSASL.begin();
    for( ; citrSAS != m_vSASL.end(); ++citrSAS )
    {
        citrSAS->Encode( stream );
    }

    vector<SilentEntitySystem>::const_iterator citrSES = m_vSESL.begin();
    for( ; citrSES != m_vSESL.end(); ++citrSES )
    {
        citrSES->Encode( stream );
    }

    stream << m_ui32NumVariableDatum;

    vector<VarDtmPtr>::const_iterator citrVD = m_vVD.begin();
    for( ; citrVD != m_vVD.end(); ++citrVD )
    {
        ( *citrVD )->Encode( stream );
    }
}